

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushFont(ImFont *font)

{
  int iVar1;
  ImFont **__src;
  ImGuiContext *pIVar2;
  ImFont **__dest;
  int iVar3;
  int iVar4;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  if ((font == (ImFont *)0x0) && (font = (GImGui->IO).FontDefault, font == (ImFont *)0x0)) {
    font = *(((GImGui->IO).Fonts)->Fonts).Data;
  }
  SetCurrentFont(font);
  iVar4 = (pIVar2->FontStack).Size;
  iVar1 = (pIVar2->FontStack).Capacity;
  if (iVar4 == iVar1) {
    iVar4 = iVar4 + 1;
    if (iVar1 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar1 / 2 + iVar1;
    }
    if (iVar4 < iVar3) {
      iVar4 = iVar3;
    }
    if (iVar1 < iVar4) {
      __dest = (ImFont **)MemAlloc((long)iVar4 << 3);
      __src = (pIVar2->FontStack).Data;
      if (__src != (ImFont **)0x0) {
        memcpy(__dest,__src,(long)(pIVar2->FontStack).Size << 3);
        MemFree((pIVar2->FontStack).Data);
      }
      (pIVar2->FontStack).Data = __dest;
      (pIVar2->FontStack).Capacity = iVar4;
    }
  }
  (pIVar2->FontStack).Data[(pIVar2->FontStack).Size] = font;
  (pIVar2->FontStack).Size = (pIVar2->FontStack).Size + 1;
  ImDrawList::PushTextureID(pIVar2->CurrentWindow->DrawList,font->ContainerAtlas->TexID);
  return;
}

Assistant:

void ImGui::PushFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    if (!font)
        font = GetDefaultFont();
    SetCurrentFont(font);
    g.FontStack.push_back(font);
    g.CurrentWindow->DrawList->PushTextureID(font->ContainerAtlas->TexID);
}